

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.h
# Opt level: O0

void __thiscall
jbcoin::STObject::setFieldUsingSetValue<jbcoin::STVector256,jbcoin::STVector256>
          (STObject *this,SField *field,STVector256 *value)

{
  int iVar1;
  STVector256 *local_50;
  STVector256 *cf;
  STBase *rf;
  STVector256 *value_local;
  SField *field_local;
  STObject *this_local;
  
  cf = (STVector256 *)getPField(this,field,true);
  if (cf == (STVector256 *)0x0) {
    Throw<std::runtime_error,char_const(&)[16]>((char (*) [16])"Field not found");
  }
  iVar1 = (*(cf->super_STBase)._vptr_STBase[4])();
  if (iVar1 == 0) {
    cf = (STVector256 *)makeFieldPresent(this,field);
  }
  if (cf == (STVector256 *)0x0) {
    local_50 = (STVector256 *)0x0;
  }
  else {
    local_50 = (STVector256 *)__dynamic_cast(cf,&STBase::typeinfo,&STVector256::typeinfo,0);
  }
  if (local_50 == (STVector256 *)0x0) {
    Throw<std::runtime_error,char_const(&)[17]>((char (*) [17])"Wrong field type");
  }
  STVector256::setValue(local_50,value);
  return;
}

Assistant:

void setFieldUsingSetValue (SField const& field, V value)
    {
        static_assert(!std::is_lvalue_reference<V>::value, "");

        STBase* rf = getPField (field, true);

        if (! rf)
            Throw<std::runtime_error> ("Field not found");

        if (rf->getSType () == STI_NOTPRESENT)
            rf = makeFieldPresent (field);

        T* cf = dynamic_cast<T*> (rf);

        if (! cf)
            Throw<std::runtime_error> ("Wrong field type");

        cf->setValue (std::move (value));
    }